

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O3

void EV_StartLightGlowing(int tag,int upper,int lower,int tics)

{
  sector_t_conflict *sector;
  DSectorEffect *pDVar1;
  uint uVar2;
  DLighting *this;
  int iVar3;
  int iVar4;
  FSectorTagIterator it;
  FSectorTagIterator local_38;
  
  if (0 < tics) {
    iVar3 = lower;
    if (upper < lower) {
      iVar3 = upper;
    }
    if (lower < upper) {
      lower = upper;
    }
    if (tag == 0) {
      local_38.start = 0;
    }
    else {
      local_38.start = tagManager.TagHashFirst[(ulong)(uint)tag & 0xff];
    }
    local_38.searchtag = tag;
    uVar2 = FSectorTagIterator::Next(&local_38);
    if (-1 < (int)uVar2) {
      if (0x7ffe < lower) {
        lower = 0x7fff;
      }
      if (lower < -0x7fff) {
        lower = -0x8000;
      }
      iVar4 = 0x7fff;
      if (iVar3 < 0x7fff) {
        iVar4 = iVar3;
      }
      if (iVar4 < -0x7fff) {
        iVar4 = -0x8000;
      }
      do {
        sector = sectors + uVar2;
        pDVar1 = sectors[uVar2].lightingdata.field_0.p;
        if (pDVar1 == (DSectorEffect *)0x0) {
LAB_004025b3:
          this = (DLighting *)
                 M_Malloc_Dbg(0x58,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                              ,0x1f9);
          DLighting::DLighting(this,(sector_t *)sector);
          (this->super_DSectorEffect).super_DThinker.super_DObject._vptr_DObject =
               (_func_int **)&PTR_StaticType_006f9378;
          *(int *)&this[1].super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject = lower;
          *(int *)((long)&this[1].super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject + 4
                  ) = iVar4;
          *(int *)&this[1].super_DSectorEffect.super_DThinker.super_DObject.Class = tics;
          *(undefined4 *)((long)&this[1].super_DSectorEffect.super_DThinker.super_DObject.Class + 4)
               = 0xffffffff;
          *(undefined1 *)&this[1].super_DSectorEffect.super_DThinker.super_DObject.ObjNext = 0;
        }
        else if (((pDVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
          (sector->lightingdata).field_0.p = (DSectorEffect *)0x0;
          goto LAB_004025b3;
        }
        uVar2 = FSectorTagIterator::Next(&local_38);
      } while (-1 < (int)uVar2);
    }
  }
  return;
}

Assistant:

void EV_StartLightGlowing (int tag, int upper, int lower, int tics)
{
	int secnum;

	// If tics is non-positive, then we can't really do anything.
	if (tics <= 0)
	{
		return;
	}

	if (upper < lower)
	{
		int temp = upper;
		upper = lower;
		lower = temp;
	}

	FSectorTagIterator it(tag);
	while ((secnum = it.Next()) >= 0)
	{
		sector_t *sec = &sectors[secnum];
		if (sec->lightingdata)
			continue;
		
		new DGlow2 (sec, upper, lower, tics, false);
	}
}